

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdFreePsbtByteDataList(void *handle,void *data_list_handle)

{
  void *pvVar1;
  long in_RSI;
  string *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  CfdCapiPsbtByteDataListHandle *list_handle;
  int result;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_ffffffffffffff40;
  allocator local_81;
  string local_80 [4];
  uint32_t in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  long local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"PsbtDataList",&local_51);
    cfd::capi::CheckBuffer(except,in_stack_00000038);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (*(long *)(local_18 + 0x10) != 0) {
      pvVar1 = *(void **)(local_18 + 0x10);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  (in_stack_ffffffffffffff40);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(local_18 + 0x10) = 0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"PsbtDataList",&local_81);
    cfd::capi::FreeBuffer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return 0;
}

Assistant:

int CfdFreePsbtByteDataList(void* handle, void* data_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (data_list_handle != nullptr) {
      CheckBuffer(data_list_handle, kPrefixPsbtByteDataList);
      CfdCapiPsbtByteDataListHandle* list_handle =
          static_cast<CfdCapiPsbtByteDataListHandle*>(data_list_handle);
      if (list_handle->data_list != nullptr) {
        delete list_handle->data_list;
        list_handle->data_list = nullptr;
      }
      FreeBuffer(
          data_list_handle, kPrefixPsbtByteDataList,
          sizeof(CfdCapiPsbtByteDataListHandle));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}